

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O0

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::upToLast
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *find,bool includeFind)

{
  byte in_CL;
  undefined7 in_register_00000011;
  undefined8 extraout_RDX;
  VerySimpleReadOnlyString VVar1;
  uint local_58;
  uint local_54;
  char *local_48;
  uint pos;
  bool includeFind_local;
  VerySimpleReadOnlyString *find_local;
  VerySimpleReadOnlyString *this_local;
  
  local_58 = reverseFind(find,(VerySimpleReadOnlyString *)CONCAT71(in_register_00000011,includeFind)
                         ,0xffffffff);
  if ((local_58 == find->length) && ((in_CL & 1) != 0)) {
    local_48 = "";
  }
  else {
    local_48 = find->data;
  }
  if ((in_CL & 1) != 0) {
    if (local_58 == find->length) {
      local_54 = 0;
    }
    else {
      local_54 = local_58 +
                 ((VerySimpleReadOnlyString *)CONCAT71(in_register_00000011,includeFind))->length;
    }
    local_58 = local_54;
  }
  VerySimpleReadOnlyString(this,local_48,local_58);
  VVar1._8_8_ = extraout_RDX;
  VVar1.data = (tCharPtr)this;
  return VVar1;
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::upToLast(const VerySimpleReadOnlyString & find, const bool includeFind) const
	{
	    const unsigned int pos = reverseFind(find);
	    return VerySimpleReadOnlyString(pos == (unsigned int)length && includeFind ? "" : data, includeFind ? (pos == (unsigned int)length ? 0 : pos + (unsigned int)find.length) : pos);
	}